

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
ear::real_quadratic_roots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,double a,double b,
          double c)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  vector<double,_std::allocator<double>_> *pvVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  double dVar3;
  allocator<double> local_c9;
  double local_c8;
  iterator local_c0;
  size_type local_b8;
  allocator<double> local_a9;
  double local_a8;
  double local_a0;
  iterator local_98;
  size_type local_90;
  double local_88;
  double det;
  double local_78;
  iterator local_70;
  size_type local_68;
  allocator<double> local_49;
  double local_48;
  iterator local_40;
  size_type local_38;
  double local_30;
  double eps;
  double c_local;
  double b_local;
  double a_local;
  
  local_30 = 1e-10;
  pvVar1 = __return_storage_ptr__;
  eps = c;
  c_local = b;
  b_local = a;
  a_local = (double)__return_storage_ptr__;
  std::abs((int)__return_storage_ptr__);
  if (local_30 <= extraout_XMM0_Qa) {
    std::abs((int)pvVar1);
    dVar3 = c_local;
    if (local_30 <= extraout_XMM0_Qa_00) {
      local_88 = c_local * c_local + -(b_local * 4.0 * eps);
      if (local_88 <= local_30) {
        if (local_88 <= -local_30) {
          memset(__return_storage_ptr__,0,0x18);
          std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
        }
        else {
          local_c8 = -c_local / (b_local + b_local);
          local_c0 = &local_c8;
          local_b8 = 1;
          std::allocator<double>::allocator(&local_c9);
          __l._M_len = local_b8;
          __l._M_array = local_c0;
          std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l,&local_c9)
          ;
          std::allocator<double>::~allocator(&local_c9);
        }
      }
      else {
        dVar2 = sqrt(local_88);
        local_a8 = (dVar2 - dVar3) / (b_local + b_local);
        dVar3 = -c_local;
        dVar2 = sqrt(local_88);
        local_a0 = (dVar3 - dVar2) / (b_local + b_local);
        local_98 = &local_a8;
        local_90 = 2;
        std::allocator<double>::allocator(&local_a9);
        __l_00._M_len = local_90;
        __l_00._M_array = local_98;
        std::vector<double,_std::allocator<double>_>::vector
                  (__return_storage_ptr__,__l_00,&local_a9);
        std::allocator<double>::~allocator(&local_a9);
      }
    }
    else {
      local_78 = -eps / c_local;
      local_70 = &local_78;
      local_68 = 1;
      std::allocator<double>::allocator((allocator<double> *)((long)&det + 7));
      __l_01._M_len = local_68;
      __l_01._M_array = local_70;
      std::vector<double,_std::allocator<double>_>::vector
                (__return_storage_ptr__,__l_01,(allocator<double> *)((long)&det + 7));
      std::allocator<double>::~allocator((allocator<double> *)((long)&det + 7));
    }
  }
  else {
    local_48 = 0.0;
    local_40 = &local_48;
    local_38 = 1;
    std::allocator<double>::allocator(&local_49);
    __l_02._M_len = local_38;
    __l_02._M_array = local_40;
    std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l_02,&local_49);
    std::allocator<double>::~allocator(&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> real_quadratic_roots(double a, double b, double c) {
    double eps = 1e-10;

    if (std::abs(c) < eps) return {0.0};
    if (std::abs(a) < eps) return {-c / b};

    double det = b * b - 4.0 * a * c;
    if (det > eps)
      return {(-b + sqrt(det)) / (2.0 * a), (-b - sqrt(det)) / (2.0 * a)};
    else if (det > -eps)
      return {-b / (2.0 * a)};
    else
      return {};
  }